

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_job_help.hh
# Opt level: O0

void add_help_1(QPDFArgParser *ap)

{
  QPDFArgParser *pQVar1;
  allocator<char> local_b31;
  string local_b30;
  allocator<char> local_b09;
  string local_b08;
  allocator<char> local_ae1;
  string local_ae0;
  allocator<char> local_ab9;
  string local_ab8;
  allocator<char> local_a91;
  string local_a90;
  allocator<char> local_a69;
  string local_a68;
  allocator<char> local_a41;
  string local_a40;
  allocator<char> local_a19;
  string local_a18;
  allocator<char> local_9f1;
  string local_9f0;
  allocator<char> local_9c9;
  string local_9c8;
  allocator<char> local_9a1;
  string local_9a0;
  allocator<char> local_979;
  string local_978;
  allocator<char> local_951;
  string local_950;
  allocator<char> local_929;
  string local_928;
  allocator<char> local_901;
  string local_900;
  allocator<char> local_8d9;
  string local_8d8;
  allocator<char> local_8b1;
  string local_8b0;
  allocator<char> local_889;
  string local_888;
  allocator<char> local_861;
  string local_860;
  allocator<char> local_839;
  string local_838;
  allocator<char> local_811;
  string local_810;
  allocator<char> local_7e9;
  string local_7e8;
  allocator<char> local_7c1;
  string local_7c0;
  allocator<char> local_799;
  string local_798;
  allocator<char> local_771;
  string local_770;
  allocator<char> local_749;
  string local_748;
  allocator<char> local_721;
  string local_720;
  allocator<char> local_6f9;
  string local_6f8;
  allocator<char> local_6d1;
  string local_6d0;
  allocator<char> local_6a9;
  string local_6a8;
  allocator<char> local_681;
  string local_680;
  allocator<char> local_659;
  string local_658;
  allocator<char> local_631;
  string local_630;
  allocator<char> local_609;
  string local_608;
  allocator<char> local_5e1;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  allocator<char> local_591;
  string local_590;
  allocator<char> local_569;
  string local_568;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  QPDFArgParser *local_10;
  QPDFArgParser *ap_local;
  
  local_10 = ap;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"usage",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"basic invocation",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,
             "Read a PDF file, apply transformations or modifications, and write\na new PDF file.\n\nUsage: qpdf [infile] [options] [outfile]\n   OR  qpdf --help[={topic|--option}]\n\n- infile, options, and outfile may be in any order as long as infile\n  precedes outfile.\n- Use --empty in place of an input file for a zero-page, empty input\n- Use --replace-input in place of an output file to overwrite the\n  input file with the output\n- outfile may be - to write to stdout; reading from stdin is not supported\n- @filename is an argument file; each line is treated as a separate\n  command-line argument\n- @- may be used to read arguments from stdin\n- Later options may override earlier options if contradictory\n"
             ,&local_91);
  QPDFArgParser::addHelpTopic(ap,&local_30,&local_68,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"--empty",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"usage",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"use empty file as input",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,
             "Use in place of infile for an empty input. Especially useful\nwith --pages.\n",
             &local_131);
  QPDFArgParser::addOptionHelp(pQVar1,&local_b8,&local_e0,&local_108,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"--replace-input",&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"usage",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"overwrite input with output",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,
             "Use in place of outfile to overwrite the input file with the output.\n",&local_1d1);
  QPDFArgParser::addOptionHelp(pQVar1,&local_158,&local_180,&local_1a8,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"--job-json-file",&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"usage",&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"job JSON file",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,
             "--job-json-file=file\n\nSpecify the name of a file whose contents are expected to\ncontain a QPDFJob JSON file. Run qpdf --job-json-help for a\ndescription of the JSON input file format.\n"
             ,&local_271);
  QPDFArgParser::addOptionHelp(pQVar1,&local_1f8,&local_220,&local_248,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"exit-status",&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"meanings of qpdf\'s exit codes",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,
             "Meaning of exit codes:\n\n- 0: no errors or warnings\n- 1: not used by qpdf but may be used by the shell if unable to invoke qpdf\n- 2: errors detected\n- 3: warnings detected, unless --warning-exit-0 is given\n"
             ,&local_2e9);
  QPDFArgParser::addHelpTopic(pQVar1,&local_298,&local_2c0,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"--warning-exit-0",&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"exit-status",&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"exit 0 even with warnings",&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,
             "Use exit status 0 instead of 3 when warnings are present. When\ncombined with --no-warn, warnings are completely ignored.\n"
             ,&local_389);
  QPDFArgParser::addOptionHelp(pQVar1,&local_310,&local_338,&local_360,&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"completion",&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,"shell completion",&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,
             "Shell completion is supported with bash and zsh. Use\neval $(qpdf --completion-bash) or eval $(qpdf --completion-zsh)\nto enable. The QPDF_EXECUTABLE environment variable overrides the\npath to qpdf that these commands output.\n"
             ,&local_401);
  QPDFArgParser::addHelpTopic(pQVar1,&local_3b0,&local_3d8,&local_400);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,"--completion-bash",&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"completion",&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,"enable bash completion",&local_479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a0,"Output a command that enables bash completion\n",&local_4a1);
  QPDFArgParser::addOptionHelp(pQVar1,&local_428,&local_450,&local_478,&local_4a0);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"--completion-zsh",&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"completion",&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"enable zsh completion",&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_540,"Output a command that enables zsh completion\n",&local_541);
  QPDFArgParser::addOptionHelp(pQVar1,&local_4c8,&local_4f0,&local_518,&local_540);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator(&local_541);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator(&local_519);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"help",&local_569);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_590,"information about qpdf",&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,
             "Help options provide some information about qpdf itself. Help\noptions are only valid as the first and only command-line argument.\n"
             ,&local_5b9);
  QPDFArgParser::addHelpTopic(pQVar1,&local_568,&local_590,&local_5b8);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator(&local_591);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator(&local_569);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e0,"--help",&local_5e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,"help",&local_609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_630,"provide help",&local_631)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_658,
             "--help[=--option|topic]\n\n--help: provide general information and a list of topics\n--help=--option: provide help on a specific option\n--help=topic: provide help on a topic\n"
             ,&local_659);
  QPDFArgParser::addOptionHelp(pQVar1,&local_5e0,&local_608,&local_630,&local_658);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator(&local_659);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator(&local_631);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator(&local_609);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator(&local_5e1);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_680,"--version",&local_681);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a8,"help",&local_6a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d0,"show qpdf version",&local_6d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f8,"Display the version of qpdf.\n",&local_6f9);
  QPDFArgParser::addOptionHelp(pQVar1,&local_680,&local_6a8,&local_6d0,&local_6f8);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator(&local_681);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_720,"--copyright",&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_748,"help",&local_749);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_770,"show copyright information",&local_771);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_798,"Display copyright and license information.\n",&local_799);
  QPDFArgParser::addOptionHelp(pQVar1,&local_720,&local_748,&local_770,&local_798);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator(&local_799);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator(&local_771);
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator(&local_749);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c0,"--show-crypto",&local_7c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e8,"help",&local_7e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_810,"show available crypto providers",&local_811);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_838,
             "Show a list of available crypto providers, one per line. The\ndefault provider is shown first.\n"
             ,&local_839);
  QPDFArgParser::addOptionHelp(pQVar1,&local_7c0,&local_7e8,&local_810,&local_838);
  std::__cxx11::string::~string((string *)&local_838);
  std::allocator<char>::~allocator(&local_839);
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator(&local_811);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::allocator<char>::~allocator(&local_7e9);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_860,"--job-json-help",&local_861);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_888,"help",&local_889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8b0,"show format of job JSON",&local_8b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8d8,
             "Describe the format of the QPDFJob JSON input used by\n--job-json-file.\n",&local_8d9)
  ;
  QPDFArgParser::addOptionHelp(pQVar1,&local_860,&local_888,&local_8b0,&local_8d8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::allocator<char>::~allocator(&local_8b1);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator(&local_889);
  std::__cxx11::string::~string((string *)&local_860);
  std::allocator<char>::~allocator(&local_861);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_900,"--zopfli",&local_901);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_928,"help",&local_929);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_950,"indicate whether zopfli is enabled and active",&local_951);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_978,
             "If zopfli support is compiled in, indicate whether it is active,\nand exit normally. Otherwise, indicate that it is not compiled\nin, and exit with an error code. If zopfli is compiled in,\nactivate it by setting the ``QPDF_ZOPFLI`` environment variable.\n"
             ,&local_979);
  QPDFArgParser::addOptionHelp(pQVar1,&local_900,&local_928,&local_950,&local_978);
  std::__cxx11::string::~string((string *)&local_978);
  std::allocator<char>::~allocator(&local_979);
  std::__cxx11::string::~string((string *)&local_950);
  std::allocator<char>::~allocator(&local_951);
  std::__cxx11::string::~string((string *)&local_928);
  std::allocator<char>::~allocator(&local_929);
  std::__cxx11::string::~string((string *)&local_900);
  std::allocator<char>::~allocator(&local_901);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9a0,"general",&local_9a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9c8,"general options",&local_9c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9f0,
             "General options control qpdf\'s behavior in ways that are not\ndirectly related to the operation it is performing.\n"
             ,&local_9f1);
  QPDFArgParser::addHelpTopic(pQVar1,&local_9a0,&local_9c8,&local_9f0);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::allocator<char>::~allocator(&local_9f1);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::allocator<char>::~allocator(&local_9c9);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::allocator<char>::~allocator(&local_9a1);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a18,"--password",&local_a19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a40,"general",&local_a41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a68,"password for encrypted file",&local_a69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a90,
             "--password=password\n\nSpecify a password for an encrypted, password-protected file.\nNot needed for encrypted files without a password.\n"
             ,&local_a91);
  QPDFArgParser::addOptionHelp(pQVar1,&local_a18,&local_a40,&local_a68,&local_a90);
  std::__cxx11::string::~string((string *)&local_a90);
  std::allocator<char>::~allocator(&local_a91);
  std::__cxx11::string::~string((string *)&local_a68);
  std::allocator<char>::~allocator(&local_a69);
  std::__cxx11::string::~string((string *)&local_a40);
  std::allocator<char>::~allocator(&local_a41);
  std::__cxx11::string::~string((string *)&local_a18);
  std::allocator<char>::~allocator(&local_a19);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ab8,"--password-file",&local_ab9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ae0,"general",&local_ae1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b08,"read password from a file",&local_b09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b30,
             "--password-file=filename\n\nThe first line of the specified file is used as the password.\nThis is used in place of the --password option.\n"
             ,&local_b31);
  QPDFArgParser::addOptionHelp(pQVar1,&local_ab8,&local_ae0,&local_b08,&local_b30);
  std::__cxx11::string::~string((string *)&local_b30);
  std::allocator<char>::~allocator(&local_b31);
  std::__cxx11::string::~string((string *)&local_b08);
  std::allocator<char>::~allocator(&local_b09);
  std::__cxx11::string::~string((string *)&local_ae0);
  std::allocator<char>::~allocator(&local_ae1);
  std::__cxx11::string::~string((string *)&local_ab8);
  std::allocator<char>::~allocator(&local_ab9);
  return;
}

Assistant:

static void add_help_1(QPDFArgParser& ap)
{
ap.addHelpTopic("usage", "basic invocation", R"(Read a PDF file, apply transformations or modifications, and write
a new PDF file.

Usage: qpdf [infile] [options] [outfile]
   OR  qpdf --help[={topic|--option}]

- infile, options, and outfile may be in any order as long as infile
  precedes outfile.
- Use --empty in place of an input file for a zero-page, empty input
- Use --replace-input in place of an output file to overwrite the
  input file with the output
- outfile may be - to write to stdout; reading from stdin is not supported
- @filename is an argument file; each line is treated as a separate
  command-line argument
- @- may be used to read arguments from stdin
- Later options may override earlier options if contradictory
)");
ap.addOptionHelp("--empty", "usage", "use empty file as input", R"(Use in place of infile for an empty input. Especially useful
with --pages.
)");
ap.addOptionHelp("--replace-input", "usage", "overwrite input with output", R"(Use in place of outfile to overwrite the input file with the output.
)");
ap.addOptionHelp("--job-json-file", "usage", "job JSON file", R"(--job-json-file=file

Specify the name of a file whose contents are expected to
contain a QPDFJob JSON file. Run qpdf --job-json-help for a
description of the JSON input file format.
)");
ap.addHelpTopic("exit-status", "meanings of qpdf's exit codes", R"(Meaning of exit codes:

- 0: no errors or warnings
- 1: not used by qpdf but may be used by the shell if unable to invoke qpdf
- 2: errors detected
- 3: warnings detected, unless --warning-exit-0 is given
)");
ap.addOptionHelp("--warning-exit-0", "exit-status", "exit 0 even with warnings", R"(Use exit status 0 instead of 3 when warnings are present. When
combined with --no-warn, warnings are completely ignored.
)");
ap.addHelpTopic("completion", "shell completion", R"(Shell completion is supported with bash and zsh. Use
eval $(qpdf --completion-bash) or eval $(qpdf --completion-zsh)
to enable. The QPDF_EXECUTABLE environment variable overrides the
path to qpdf that these commands output.
)");
ap.addOptionHelp("--completion-bash", "completion", "enable bash completion", R"(Output a command that enables bash completion
)");
ap.addOptionHelp("--completion-zsh", "completion", "enable zsh completion", R"(Output a command that enables zsh completion
)");
ap.addHelpTopic("help", "information about qpdf", R"(Help options provide some information about qpdf itself. Help
options are only valid as the first and only command-line argument.
)");
ap.addOptionHelp("--help", "help", "provide help", R"(--help[=--option|topic]

--help: provide general information and a list of topics
--help=--option: provide help on a specific option
--help=topic: provide help on a topic
)");
ap.addOptionHelp("--version", "help", "show qpdf version", R"(Display the version of qpdf.
)");
ap.addOptionHelp("--copyright", "help", "show copyright information", R"(Display copyright and license information.
)");
ap.addOptionHelp("--show-crypto", "help", "show available crypto providers", R"(Show a list of available crypto providers, one per line. The
default provider is shown first.
)");
ap.addOptionHelp("--job-json-help", "help", "show format of job JSON", R"(Describe the format of the QPDFJob JSON input used by
--job-json-file.
)");
ap.addOptionHelp("--zopfli", "help", "indicate whether zopfli is enabled and active", R"(If zopfli support is compiled in, indicate whether it is active,
and exit normally. Otherwise, indicate that it is not compiled
in, and exit with an error code. If zopfli is compiled in,
activate it by setting the ``QPDF_ZOPFLI`` environment variable.
)");
ap.addHelpTopic("general", "general options", R"(General options control qpdf's behavior in ways that are not
directly related to the operation it is performing.
)");
ap.addOptionHelp("--password", "general", "password for encrypted file", R"(--password=password

Specify a password for an encrypted, password-protected file.
Not needed for encrypted files without a password.
)");
ap.addOptionHelp("--password-file", "general", "read password from a file", R"(--password-file=filename

The first line of the specified file is used as the password.
This is used in place of the --password option.
)");
}